

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O1

void predicate_suite::test_all_of(void)

{
  bool bVar1;
  reference piVar2;
  reference piVar3;
  circular_view<int,_18446744073709551615UL> *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  basic_iterator<int> local_98;
  basic_iterator<int> local_88;
  basic_iterator<int> local_78;
  circular_view<int,_18446744073709551615UL> local_68;
  type local_48 [6];
  
  local_68.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_68.member.cap = 4;
  local_68.member.size = 0;
  local_68.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0xb;
  uVar6 = local_68.member.cap * 2;
  uVar5 = uVar6 - (local_68.member.cap & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    local_98.current = uVar6 - 1 & local_68.member.next - local_68.member.size;
  }
  else {
    local_98.current = (local_68.member.next - local_68.member.size) % uVar6;
  }
  if ((byte)(uVar5 >> 0x38) < 2) {
    uVar6 = uVar6 - 1 & local_68.member.next;
  }
  else {
    uVar6 = local_68.member.next % uVar6;
  }
  lVar7 = (long)(uVar6 - local_98.current) >> 2;
  local_98.parent = &local_68;
  local_78.parent = &local_68;
  local_78.current = uVar6;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00104e10;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00104e10;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00104e10;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00104e10;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = uVar6 - local_98.current;
  if (lVar7 == 1) {
LAB_00104de7:
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar3 == 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      pcVar4 = &local_68;
      uVar5 = uVar6;
    }
  }
  else if (lVar7 == 2) {
LAB_00104dc9:
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar3 == 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      goto LAB_00104de7;
    }
  }
  else {
    pcVar4 = &local_68;
    uVar5 = uVar6;
    if (lVar7 == 3) {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 == 0xb) {
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  (&local_98);
        goto LAB_00104dc9;
      }
    }
  }
LAB_00104e10:
  local_88.parent = pcVar4;
  local_88.current = uVar5;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a1,"void predicate_suite::test_all_of()",bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0xb;
  uVar6 = local_68.member.cap * 2;
  uVar5 = uVar6 - (local_68.member.cap & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    local_98.current = uVar6 - 1 & local_68.member.next - local_68.member.size;
  }
  else {
    local_98.current = (local_68.member.next - local_68.member.size) % uVar6;
  }
  if ((byte)(uVar5 >> 0x38) < 2) {
    uVar6 = uVar6 - 1 & local_68.member.next;
  }
  else {
    uVar6 = local_68.member.next % uVar6;
  }
  lVar7 = (long)(uVar6 - local_98.current) >> 2;
  local_98.parent = &local_68;
  local_78.parent = &local_68;
  local_78.current = uVar6;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00105043;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00105043;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00105043;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00105043;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = uVar6 - local_98.current;
  if (lVar7 == 1) {
LAB_0010501a:
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar3 == 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      pcVar4 = &local_68;
      uVar5 = uVar6;
    }
  }
  else if (lVar7 == 2) {
LAB_00104ffc:
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar3 == 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      goto LAB_0010501a;
    }
  }
  else {
    pcVar4 = &local_68;
    uVar5 = uVar6;
    if (lVar7 == 3) {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 == 0xb) {
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  (&local_98);
        goto LAB_00104ffc;
      }
    }
  }
LAB_00105043:
  local_88.parent = pcVar4;
  local_88.current = uVar5;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a3,"void predicate_suite::test_all_of()",bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0x37;
  uVar6 = local_68.member.cap * 2;
  uVar5 = uVar6 - (local_68.member.cap & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    local_98.current = uVar6 - 1 & local_68.member.next - local_68.member.size;
  }
  else {
    local_98.current = (local_68.member.next - local_68.member.size) % uVar6;
  }
  if ((byte)(uVar5 >> 0x38) < 2) {
    uVar6 = uVar6 - 1 & local_68.member.next;
  }
  else {
    uVar6 = local_68.member.next % uVar6;
  }
  lVar7 = (long)(uVar6 - local_98.current) >> 2;
  local_98.parent = &local_68;
  local_78.parent = &local_68;
  local_78.current = uVar6;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00105276;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00105276;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00105276;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0xb) goto LAB_00105276;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = uVar6 - local_98.current;
  if (lVar7 == 1) {
LAB_0010524d:
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar3 == 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      pcVar4 = &local_68;
      uVar5 = uVar6;
    }
  }
  else if (lVar7 == 2) {
LAB_0010522f:
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar3 == 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      goto LAB_0010524d;
    }
  }
  else {
    pcVar4 = &local_68;
    uVar5 = uVar6;
    if (lVar7 == 3) {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 == 0xb) {
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  (&local_98);
        goto LAB_0010522f;
      }
    }
  }
LAB_00105276:
  local_88.parent = pcVar4;
  local_88.current = uVar5;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("!std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a5,"void predicate_suite::test_all_of()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0x37;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0x37;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0x37;
  uVar6 = local_68.member.cap * 2;
  uVar5 = uVar6 - (local_68.member.cap & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar5 >> 0x38 < 2) {
    local_98.current = uVar6 - 1 & local_68.member.next - local_68.member.size;
  }
  else {
    local_98.current = (local_68.member.next - local_68.member.size) % uVar6;
  }
  if ((byte)(uVar5 >> 0x38) < 2) {
    uVar6 = uVar6 - 1 & local_68.member.next;
  }
  else {
    uVar6 = local_68.member.next % uVar6;
  }
  lVar7 = (long)(uVar6 - local_98.current) >> 2;
  local_98.parent = &local_68;
  local_78.parent = &local_68;
  local_78.current = uVar6;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0x37) goto LAB_001054de;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0x37) goto LAB_001054de;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0x37) goto LAB_001054de;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0x37) goto LAB_001054de;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = uVar6 - local_98.current;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pcVar4 = &local_68;
      uVar5 = uVar6;
      if (lVar7 != 3) goto LAB_001054de;
      local_88.parent = local_98.parent;
      local_88.current = local_98.current;
      piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      pcVar4 = local_98.parent;
      uVar5 = local_98.current;
      if (*piVar3 != 0x37) goto LAB_001054de;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    }
    local_88.parent = local_98.parent;
    local_88.current = local_98.current;
    piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_88);
    pcVar4 = local_98.parent;
    uVar5 = local_98.current;
    if (*piVar3 != 0x37) goto LAB_001054de;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
  }
  local_88.parent = local_98.parent;
  local_88.current = local_98.current;
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_88);
  pcVar4 = local_98.parent;
  uVar5 = local_98.current;
  if (*piVar3 == 0x37) {
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_98);
    pcVar4 = &local_68;
    uVar5 = uVar6;
  }
LAB_001054de:
  local_88.parent = pcVar4;
  local_88.current = uVar5;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_78,&local_88);
  boost::detail::test_impl
            ("std::all_of(span.begin(), span.end(), [] (int current) { return current == 55; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1a9,"void predicate_suite::test_all_of()",bVar1);
  return;
}

Assistant:

void test_all_of()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(11);
    BOOST_TEST(std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(11);
    BOOST_TEST(std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    BOOST_TEST(!std::all_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    span.push_back(55);
    span.push_back(55);
    BOOST_TEST(std::all_of(span.begin(), span.end(), [] (int current) { return current == 55; }));
}